

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O2

int __thiscall
mcts::RandomPlayout<ttt::Board>::operator()(RandomPlayout<ttt::Board> *this,Board *game)

{
  int iVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  vector<long,_std::allocator<long>_> moves;
  Board ngame;
  uniform_int_distribution<int> local_58;
  _Vector_base<long,_std::allocator<long>_> local_50;
  Board local_38;
  
  if (operator()(ttt::Board_const&)::rd == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(ttt::Board_const&)::rd);
    if (iVar1 != 0) {
      std::random_device::random_device(&operator()::rd);
      __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
      __cxa_guard_release(&operator()(ttt::Board_const&)::rd);
    }
  }
  if (operator()(ttt::Board_const&)::gen == '\0') {
    iVar1 = __cxa_guard_acquire(&operator()(ttt::Board_const&)::gen);
    if (iVar1 != 0) {
      uVar3 = std::random_device::_M_getval();
      std::
      mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
      ::seed(&operator()::gen,(ulong)uVar3);
      __cxa_guard_release(&operator()(ttt::Board_const&)::gen);
    }
  }
  local_38._8_2_ = *(undefined2 *)((game->board)._M_elems[2]._M_elems + 2);
  local_38.board._M_elems._0_8_ = *(undefined8 *)(game->board)._M_elems;
  iVar1 = ttt::Board::GetStatus(&local_38);
  while (iVar1 == -1) {
    ttt::Board::GetPossibleMoves((vector<long,_std::allocator<long>_> *)&local_50,&local_38);
    local_58._M_param._M_b =
         (int)((ulong)((long)local_50._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_50._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
    local_58._M_param._M_a = 0;
    rVar2 = std::uniform_int_distribution<int>::operator()(&local_58,&operator()::gen);
    ttt::Board::ApplyMove(&local_38,local_50._M_impl.super__Vector_impl_data._M_start + rVar2);
    iVar1 = ttt::Board::GetStatus(&local_38);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_50);
  }
  return iVar1;
}

Assistant:

int
RandomPlayout<IGame>::operator()(const IGame &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        auto moves = ngame.GetPossibleMoves();
        ngame.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        status = ngame.GetStatus();
    }
    return status;
}